

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3D.h
# Opt level: O2

Vector3D * CMU462::cross(Vector3D *u,Vector3D *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3D *in_RDI;
  
  dVar1 = v->x;
  dVar2 = u->x;
  dVar3 = u->y;
  dVar4 = u->z;
  dVar5 = v->y;
  dVar6 = v->z;
  in_RDI->x = dVar6 * dVar3 - dVar4 * dVar5;
  in_RDI->y = dVar1 * dVar4 - dVar2 * dVar6;
  in_RDI->z = dVar2 * dVar5 - dVar1 * dVar3;
  return in_RDI;
}

Assistant:

inline Vector3D cross( const Vector3D& u, const Vector3D& v ) {
  return Vector3D( u.y*v.z - u.z*v.y,
                   u.z*v.x - u.x*v.z,
                   u.x*v.y - u.y*v.x );
}